

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

Symbol * __thiscall slang::ast::Scope::find(Scope *this,string_view name)

{
  char *pcVar1;
  SymbolKind SVar2;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  long lVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  uint64_t uVar12;
  SubroutineSymbol *pSVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  basic_string_view<char,_std::char_traits<char>_> *pbVar17;
  undefined1 auVar18 [16];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  ensureElaborated(this);
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
  uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_00,&local_40);
  uVar15 = uVar12 >> ((byte)*this_00 & 0x3f);
  lVar16 = (uVar12 & 0xff) * 4;
  cVar5 = (&UNK_003fea9c)[lVar16];
  cVar6 = (&UNK_003fea9d)[lVar16];
  cVar7 = (&UNK_003fea9e)[lVar16];
  bVar8 = (&UNK_003fea9f)[lVar16];
  uVar14 = 0;
  do {
    lVar16 = *(long *)(this_00 + 0x10);
    pcVar1 = (char *)(lVar16 + uVar15 * 0x10);
    bVar10 = pcVar1[0xf];
    auVar18[0] = -(*pcVar1 == cVar5);
    auVar18[1] = -(pcVar1[1] == cVar6);
    auVar18[2] = -(pcVar1[2] == cVar7);
    auVar18[3] = -(pcVar1[3] == bVar8);
    auVar18[4] = -(pcVar1[4] == cVar5);
    auVar18[5] = -(pcVar1[5] == cVar6);
    auVar18[6] = -(pcVar1[6] == cVar7);
    auVar18[7] = -(pcVar1[7] == bVar8);
    auVar18[8] = -(pcVar1[8] == cVar5);
    auVar18[9] = -(pcVar1[9] == cVar6);
    auVar18[10] = -(pcVar1[10] == cVar7);
    auVar18[0xb] = -(pcVar1[0xb] == bVar8);
    auVar18[0xc] = -(pcVar1[0xc] == cVar5);
    auVar18[0xd] = -(pcVar1[0xd] == cVar6);
    auVar18[0xe] = -(pcVar1[0xe] == cVar7);
    auVar18[0xf] = -(bVar10 == bVar8);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar11 != 0) {
      lVar3 = *(long *)(this_00 + 0x18);
      do {
        uVar4 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        pbVar17 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((ulong)uVar4 * 0x18 + lVar3 + uVar15 * 0x168);
        bVar9 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           this_00,&local_40,pbVar17);
        if (bVar9) {
          pbVar17 = pbVar17 + 1;
          while( true ) {
            pSVar13 = (SubroutineSymbol *)pbVar17->_M_len;
            SVar2 = (pSVar13->super_Symbol).kind;
            if (SVar2 != TransparentMember) break;
            pbVar17 = (basic_string_view<char,_std::char_traits<char>_> *)&pSVar13->super_Scope;
          }
          if (SVar2 != ForwardingTypedef) {
            if (SVar2 == ModportClocking) {
              return &(*(SubroutineSymbol **)&pSVar13->super_Scope)->super_Symbol;
            }
            if (SVar2 != ExplicitImport) {
              if (SVar2 != MethodPrototype) {
                return &pSVar13->super_Symbol;
              }
              pSVar13 = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar13);
              return &pSVar13->super_Symbol;
            }
          }
          return &((SubroutineSymbol *)0x0)->super_Symbol;
        }
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar10 = *(byte *)(lVar16 + uVar15 * 0x10 + 0xf);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar10) == 0) {
      return &((SubroutineSymbol *)0x0)->super_Symbol;
    }
    lVar16 = uVar15 + uVar14;
    uVar14 = uVar14 + 1;
    uVar15 = lVar16 + 1U & *(ulong *)(this_00 + 8);
  } while (uVar14 <= *(ulong *)(this_00 + 8));
  return &((SubroutineSymbol *)0x0)->super_Symbol;
}

Assistant:

const Symbol* Scope::find(std::string_view name) const {
    // Just do a simple lookup and return the result if we have one.
    ensureElaborated();
    auto it = nameMap->find(name);
    if (it == nameMap->end())
        return nullptr;

    // Unwrap the symbol if it's a transparent member. Don't return imported
    // symbols; this function is for querying direct members only.
    const Symbol* symbol = it->second;
    while (symbol->kind == SymbolKind::TransparentMember)
        symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

    switch (symbol->kind) {
        case SymbolKind::ExplicitImport:
        case SymbolKind::ForwardingTypedef:
            return nullptr;
        case SymbolKind::MethodPrototype:
            return symbol->as<MethodPrototypeSymbol>().getSubroutine();
        case SymbolKind::ModportClocking:
            return symbol->as<ModportClockingSymbol>().target;
        default:
            return symbol;
    }
}